

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
ExternalFixupMembersImport_IsWeak_Test::TestBody(ExternalFixupMembersImport_IsWeak_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  error_code *peVar4;
  char *in_R9;
  error_code eVar5;
  AssertHelper local_3f8;
  Message local_3f0;
  error_code local_3e8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_3a8;
  Message local_3a0;
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__1;
  string local_378;
  parser<pstore::exchange::import_ns::callbacks> local_358;
  parser<pstore::exchange::import_ns::callbacks> *local_2b0;
  parser<pstore::exchange::import_ns::callbacks> *parser2;
  AssertHelper local_288;
  string local_280;
  Message local_260;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_;
  string local_238;
  parser<pstore::exchange::import_ns::callbacks> local_218;
  parser<pstore::exchange::import_ns::callbacks> *local_170;
  parser<pstore::exchange::import_ns::callbacks> *parser1;
  AssertHelper local_160;
  Message local_158;
  error_code local_150;
  allocator local_139;
  string local_138;
  not_null<transaction_base_*> local_118;
  error_code local_110;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  string_mapping imported_names;
  unique_lock<mock_mutex> local_60;
  undefined1 local_50 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mock_mutex mutex;
  ExternalFixupMembersImport_IsWeak_Test *this_local;
  
  std::unique_lock<mock_mutex>::unique_lock(&local_60,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_50,
          &(this->super_ExternalFixupMembersImport).db_,&local_60);
  std::unique_lock<mock_mutex>::~unique_lock(&local_60);
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)&gtest_ar.message_);
  pstore::gsl::not_null<pstore::transaction_base_*>::not_null
            (&local_118,(transaction_base *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"name",&local_139);
  eVar5 = pstore::exchange::import_ns::string_mapping::add_string
                    ((string_mapping *)&gtest_ar.message_,local_118,&local_138);
  local_110._M_cat = eVar5._M_cat;
  local_110._M_value = eVar5._M_value;
  std::error_code::error_code(&local_150);
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_100,"imported_names.add_string (&transaction, \"name\")",
             "std::error_code{}",&local_110,&local_150);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x216,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  parser1._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  if (parser1._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_238,"{ \"name\":0, \"type\":17, \"offset\":19, \"addend\":23 }",
               (allocator *)
               ((long)&gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    anon_unknown.dwarf_33b920::ExternalFixupMembersImport::parse
              (&local_218,&local_238,&(this->super_ExternalFixupMembersImport).db_,
               (string_mapping *)&gtest_ar.message_);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_170 = &local_218;
    local_251 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error(local_170);
    local_251 = !local_251;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_250,&local_251,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pMVar3 = testing::Message::operator<<(&local_260,(char (*) [17])"JSON error was: ");
      peVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error(local_170);
      std::error_code::message_abi_cxx11_(&local_280,peVar4);
      pMVar3 = testing::Message::operator<<(pMVar3,&local_280);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&parser2,(internal *)local_250,(AssertionResult *)"parser1.has_error ()",
                 "true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_288,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x21c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_288,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_288);
      std::__cxx11::string::~string((string *)&parser2);
      std::__cxx11::string::~string((string *)&local_280);
      testing::Message::~Message(&local_260);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&local_218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_378,
               "{ \"name\":0, \"type\":true, \"is_weak\":0, offset\":19, \"addend\":23 }",
               (allocator *)
               ((long)&gtest_ar__1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    anon_unknown.dwarf_33b920::ExternalFixupMembersImport::parse
              (&local_358,&local_378,&(this->super_ExternalFixupMembersImport).db_,
               (string_mapping *)&gtest_ar.message_);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar__1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_2b0 = &local_358;
    local_391 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error(local_2b0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_390,&local_391,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
    if (!bVar1) {
      testing::Message::Message(&local_3a0);
      pMVar3 = testing::Message::operator<<(&local_3a0,(char (*) [27])"Expected the parse to fail");
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_390,
                 (AssertionResult *)"parser2.has_error ()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x224,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3a8,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_3a0);
    }
    parser1._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
    if (parser1._4_4_ == 0) {
      peVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error(local_2b0);
      eVar5 = pstore::exchange::import_ns::make_error_code(unexpected_boolean);
      local_3e8._M_cat = eVar5._M_cat;
      local_3e8._M_value = eVar5._M_value;
      testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
                ((EqHelper *)local_3d8,"parser2.last_error ()",
                 "make_error_code (pstore::exchange::import_ns::error::unexpected_boolean)",peVar4,
                 &local_3e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
      if (!bVar1) {
        testing::Message::Message(&local_3f0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x226,pcVar2);
        testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
        testing::internal::AssertHelper::~AssertHelper(&local_3f8);
        testing::Message::~Message(&local_3f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
      parser1._4_4_ = 0;
    }
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&local_358);
    if (parser1._4_4_ == 0) {
      parser1._4_4_ = 0;
    }
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)&gtest_ar.message_)
  ;
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_50);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, IsWeak) {
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});

    pstore::exchange::import_ns::string_mapping imported_names;
    // Add a single name with index 0.
    ASSERT_EQ (imported_names.add_string (&transaction, "name"), std::error_code{});

    // The is_weak key is missing altogether. That's okay: the default is 'false'.
    {
        auto const & parser1 = this->parse (R"({ "name":0, "type":17, "offset":19, "addend":23 })",
                                            &db_, imported_names);
        EXPECT_FALSE (parser1.has_error ())
            << "JSON error was: " << parser1.last_error ().message ();
    }
    // The is_weak key has the wrong type.
    {
        auto const & parser2 =
            this->parse (R"({ "name":0, "type":true, "is_weak":0, offset":19, "addend":23 })", &db_,
                         imported_names);
        ASSERT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}